

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

bool helics::CoreFactory::copyCoreIdentifier(string_view copyFromName,string_view copyToName)

{
  bool bVar1;
  string *in_stack_00000038;
  string *in_stack_00000040;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_00000048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_79 [25];
  allocator<char> *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_41 [65];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  bVar1 = gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::copyObject
                    (in_stack_00000048,in_stack_00000040,in_stack_00000038);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator(local_79);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator(local_41);
  return bVar1;
}

Assistant:

bool copyCoreIdentifier(std::string_view copyFromName, std::string_view copyToName)
{
    return searchableCores.copyObject(std::string{copyFromName}, std::string{copyToName});
}